

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_transaction.cpp
# Opt level: O0

undefined8 __thiscall
cfd::TransactionController::AddTxIn
          (TransactionController *this,Txid *txid,uint32_t vout,Pubkey *pubkey,uint32_t sequence)

{
  undefined4 uVar1;
  uint in_ECX;
  uint in_EDX;
  long in_RSI;
  undefined8 in_RDI;
  uint in_R9D;
  uint32_t index;
  undefined4 in_stack_ffffffffffffff20;
  Pubkey local_88 [3];
  undefined4 local_30;
  
  core::ScriptBuilder::ScriptBuilder((ScriptBuilder *)0x3b353b);
  cfd::core::ScriptBuilder::AppendData(local_88);
  cfd::core::ScriptBuilder::Build();
  uVar1 = cfd::core::Transaction::AddTxIn
                    ((Txid *)(in_RSI + 0x10),in_EDX,in_ECX,(Script *)(ulong)in_R9D);
  core::Script::~Script((Script *)CONCAT44(uVar1,in_stack_ffffffffffffff20));
  core::ScriptBuilder::~ScriptBuilder((ScriptBuilder *)0x3b35a4);
  local_30 = uVar1;
  cfd::core::Transaction::GetTxIn((uint)in_RDI);
  return in_RDI;
}

Assistant:

const TxInReference TransactionController::AddTxIn(
    const Txid& txid, uint32_t vout, const Pubkey& pubkey, uint32_t sequence) {
  uint32_t index = transaction_.AddTxIn(
      txid, vout, sequence, ScriptBuilder().AppendData(pubkey).Build());
  return transaction_.GetTxIn(index);
}